

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_bff3::TypeNode::TypeNode
          (TypeNode *this,xmlNodePtr node,string *name_,string *file_,NodeLoader loader_)

{
  NodeLoader loader__local;
  string *file__local;
  string *name__local;
  xmlNodePtr node_local;
  TypeNode *this_local;
  
  this->xml = node;
  std::__cxx11::string::string((string *)&this->name,(string *)name_);
  std::__cxx11::string::string((string *)&this->file,(string *)file_);
  this->loader = loader_;
  return;
}

Assistant:

TypeNode
            ( xmlNodePtr node = 0
            , string const& name_ = string()
            , string const& file_ = string()
            , NodeLoader loader_ = 0 )
            : xml(node), name(name_), file(file_), loader(loader_) {}